

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptSession.h
# Opt level: O3

void __thiscall slang::ast::ScriptSession::~ScriptSession(ScriptSession *this)

{
  pointer p;
  EVP_PKEY_CTX *in_RSI;
  
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&(this->evalContext).warnings,in_RSI);
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)&(this->evalContext).diags,in_RSI);
  p = (this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_;
  if (p != (pointer)(this->evalContext).lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                    firstElement) {
    operator_delete(p);
  }
  SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
            (&(this->evalContext).stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,in_RSI
            );
  std::
  vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
  ::~vector(&this->syntaxTrees);
  Compilation::~Compilation(&this->compilation);
  boost::unordered::detail::foa::
  table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                 *)this);
  return;
}

Assistant:

class SLANG_EXPORT ScriptSession {
public:
    /// A bag of options to apply to the various evaluated snippets.
    Bag options;

    /// A compilation object that holds state across evaluation calls.
    Compilation compilation;

    /// A compilation unit that acts as a scope for evaluation.
    CompilationUnitSymbol& scope;

    /// Constructs a new ScriptSession.
    explicit ScriptSession(Bag options = {});

    /// Tries to evaluate the given snippet of SystemVerilog code
    /// and returns the result as a constant value.
    ConstantValue eval(std::string_view text);

    /// Tries to evaluate the given expression tree and returns the
    /// result as a constant value.
    ConstantValue evalExpression(const syntax::ExpressionSyntax& expr);

    /// Tries to evaluate the given statement tree and returns the
    /// result as a constant value.
    void evalStatement(const syntax::StatementSyntax& expr);

    /// Gets any diagnostics that have been issued during evaluation calls.
    Diagnostics getDiagnostics();

private:
    std::vector<std::shared_ptr<syntax::SyntaxTree>> syntaxTrees;
    ASTContext astCtx;
    EvalContext evalContext;
}